

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O0

int yy_term(GREG *G)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int yythunkpos509;
  int yypos509;
  int yythunkpos507;
  int yypos507;
  int yythunkpos504;
  int yypos504;
  int yythunkpos502;
  int yypos502;
  int yythunkpos500;
  int yypos500;
  int yythunkpos498;
  int yypos498;
  int yythunkpos495;
  int yypos495;
  int yythunkpos493;
  int yypos493;
  int yythunkpos485;
  int yypos485;
  int yythunkpos483;
  int yypos483;
  int yythunkpos481;
  int yypos481;
  int yythunkpos476;
  int yypos476;
  int yythunkpos472;
  int yypos472;
  int yythunkpos470;
  int yypos470;
  int yythunkpos451;
  int yypos451;
  int yythunkpos0;
  int yypos0;
  GREG *G_local;
  
  iVar1 = G->pos;
  iVar2 = G->thunkpos;
  yyDo(G,yyPush,3,0,"yyPush");
  iVar7 = G->pos;
  iVar3 = G->thunkpos;
  iVar5 = yy_complex(G);
  if (iVar5 != 0) goto LAB_0010be09;
  G->pos = iVar7;
  G->thunkpos = iVar3;
  iVar5 = yy_integer(G);
  if (iVar5 != 0) goto LAB_0010be09;
  G->pos = iVar7;
  G->thunkpos = iVar3;
  iVar5 = yy_path(G);
  if (iVar5 != 0) goto LAB_0010be09;
  G->pos = iVar7;
  G->thunkpos = iVar3;
  iVar5 = yy_dec_number(G);
  if (iVar5 != 0) goto LAB_0010be09;
  G->pos = iVar7;
  G->thunkpos = iVar3;
  iVar5 = yy_string(G);
  if (iVar5 != 0) goto LAB_0010be09;
  G->pos = iVar7;
  G->thunkpos = iVar3;
  iVar5 = yymatchChar(G,0x28);
  if (((iVar5 != 0) && (iVar5 = yy__(G), iVar5 != 0)) && (iVar5 = yy_expr(G), iVar5 != 0)) {
    yyDo(G,yySet,-3,0,"yySet");
    iVar5 = yy__(G);
    if ((iVar5 != 0) && (iVar5 = yymatchChar(G,0x29), iVar5 != 0)) {
      yyDo(G,yy_1_term,G->begin,G->end,"yy_1_term");
      goto LAB_0010be09;
    }
  }
  G->pos = iVar7;
  G->thunkpos = iVar3;
  iVar5 = yy_variable(G);
  if (iVar5 != 0) goto LAB_0010be09;
  G->pos = iVar7;
  G->thunkpos = iVar3;
  iVar5 = yymatchString(G,"$?LINE");
  if (iVar5 != 0) {
    yyDo(G,yy_2_term,G->begin,G->end,"yy_2_term");
    goto LAB_0010be09;
  }
  G->pos = iVar7;
  G->thunkpos = iVar3;
  iVar5 = yy_array(G);
  if (iVar5 != 0) goto LAB_0010be09;
  G->pos = iVar7;
  G->thunkpos = iVar3;
  iVar5 = yy_class(G);
  if (iVar5 != 0) goto LAB_0010be09;
  G->pos = iVar7;
  G->thunkpos = iVar3;
  iVar5 = yy_role(G);
  if (iVar5 != 0) goto LAB_0010be09;
  G->pos = iVar7;
  G->thunkpos = iVar3;
  iVar5 = yy_funcall(G);
  if (iVar5 != 0) goto LAB_0010be09;
  G->pos = iVar7;
  G->thunkpos = iVar3;
  iVar5 = yy_qw(G);
  if (iVar5 != 0) goto LAB_0010be09;
  G->pos = iVar7;
  G->thunkpos = iVar3;
  iVar5 = yy_hash(G);
  if (iVar5 != 0) goto LAB_0010be09;
  G->pos = iVar7;
  G->thunkpos = iVar3;
  iVar5 = yy_lambda(G);
  if (iVar5 != 0) goto LAB_0010be09;
  G->pos = iVar7;
  G->thunkpos = iVar3;
  iVar5 = yy_it_method(G);
  if (iVar5 != 0) goto LAB_0010be09;
  G->pos = iVar7;
  G->thunkpos = iVar3;
  iVar5 = yy_enum(G);
  if (iVar5 != 0) goto LAB_0010be09;
  G->pos = iVar7;
  G->thunkpos = iVar3;
  iVar5 = yymatchString(G,"pi");
  if (iVar5 != 0) {
    iVar5 = G->pos;
    iVar4 = G->thunkpos;
    iVar6 = yymatchClass(G,(uchar *)"","-a-zA-Z0-9_");
    if (iVar6 == 0) {
      G->pos = iVar5;
      G->thunkpos = iVar4;
      yyDo(G,yy_3_term,G->begin,G->end,"yy_3_term");
      goto LAB_0010be09;
    }
  }
  G->pos = iVar7;
  G->thunkpos = iVar3;
  iVar5 = yymatchChar(G,0x65);
  if (iVar5 != 0) {
    iVar5 = G->pos;
    iVar4 = G->thunkpos;
    iVar6 = yymatchClass(G,(uchar *)"","-a-zA-Z0-9_");
    if (iVar6 == 0) {
      G->pos = iVar5;
      G->thunkpos = iVar4;
      yyDo(G,yy_4_term,G->begin,G->end,"yy_4_term");
      goto LAB_0010be09;
    }
  }
  G->pos = iVar7;
  G->thunkpos = iVar3;
  iVar5 = yymatchString(G,"try");
  if (((iVar5 != 0) && (iVar5 = yy_ws(G), iVar5 != 0)) &&
     ((iVar5 = yy__(G), iVar5 != 0 && (iVar5 = yy_block(G), iVar5 != 0)))) {
    yyDo(G,yySet,-2,0,"yySet");
    yyDo(G,yy_5_term,G->begin,G->end,"yy_5_term");
    goto LAB_0010be09;
  }
  G->pos = iVar7;
  G->thunkpos = iVar3;
  iVar5 = yymatchString(G,"try");
  if ((iVar5 != 0) && (iVar5 = yy_ws(G), iVar5 != 0)) {
    do {
      iVar5 = G->pos;
      iVar4 = G->thunkpos;
      iVar6 = yy_ws(G);
    } while (iVar6 != 0);
    G->pos = iVar5;
    G->thunkpos = iVar4;
    iVar5 = yy_expr(G);
    if (iVar5 != 0) {
      yyDo(G,yySet,-2,0,"yySet");
      yyDo(G,yy_6_term,G->begin,G->end,"yy_6_term");
      goto LAB_0010be09;
    }
  }
  G->pos = iVar7;
  G->thunkpos = iVar3;
  iVar5 = yy_perl5_regexp(G);
  if (iVar5 != 0) goto LAB_0010be09;
  G->pos = iVar7;
  G->thunkpos = iVar3;
  iVar5 = yymatchString(G,"m:P5/./");
  if (iVar5 != 0) {
    yyDo(G,yy_7_term,G->begin,G->end,"yy_7_term");
    goto LAB_0010be09;
  }
  G->pos = iVar7;
  G->thunkpos = iVar3;
  iVar5 = yy_regexp(G);
  if (iVar5 != 0) goto LAB_0010be09;
  G->pos = iVar7;
  G->thunkpos = iVar3;
  iVar5 = yymatchString(G,"True");
  if (iVar5 != 0) {
    iVar5 = G->pos;
    iVar4 = G->thunkpos;
    iVar6 = yymatchClass(G,(uchar *)"","-a-zA-Z0-9");
    if (iVar6 == 0) {
      G->pos = iVar5;
      G->thunkpos = iVar4;
      yyDo(G,yy_8_term,G->begin,G->end,"yy_8_term");
      goto LAB_0010be09;
    }
  }
  G->pos = iVar7;
  G->thunkpos = iVar3;
  iVar5 = yymatchString(G,"False");
  if (iVar5 != 0) {
    iVar5 = G->pos;
    iVar4 = G->thunkpos;
    iVar6 = yymatchClass(G,(uchar *)"","-a-zA-Z0-9");
    if (iVar6 == 0) {
      G->pos = iVar5;
      G->thunkpos = iVar4;
      yyDo(G,yy_9_term,G->begin,G->end,"yy_9_term");
      goto LAB_0010be09;
    }
  }
  G->pos = iVar7;
  G->thunkpos = iVar3;
  iVar5 = G->pos;
  iVar4 = G->thunkpos;
  iVar6 = yy_reserved(G);
  if (iVar6 == 0) {
    G->pos = iVar5;
    G->thunkpos = iVar4;
    iVar5 = yy_ident(G);
    if (iVar5 != 0) goto LAB_0010be09;
  }
  G->pos = iVar7;
  G->thunkpos = iVar3;
  yyText(G,G->begin,G->end);
  G->begin = G->pos;
  iVar5 = yymatchString(G,"class");
  if (iVar5 != 0) {
    yyText(G,G->begin,G->end);
    G->end = G->pos;
    yyDo(G,yy_10_term,G->begin,G->end,"yy_10_term");
    goto LAB_0010be09;
  }
  G->pos = iVar7;
  G->thunkpos = iVar3;
  iVar5 = yy_pair(G);
  if (iVar5 != 0) goto LAB_0010be09;
  G->pos = iVar7;
  G->thunkpos = iVar3;
  iVar5 = yymatchChar(G,0x5c);
  if ((iVar5 != 0) && (iVar5 = yy_term(G), iVar5 != 0)) {
    yyDo(G,yySet,-1,0,"yySet");
    yyDo(G,yy_11_term,G->begin,G->end,"yy_11_term");
    goto LAB_0010be09;
  }
  G->pos = iVar7;
  G->thunkpos = iVar3;
  iVar5 = yymatchChar(G,0x28);
  if ((iVar5 != 0) && ((iVar5 = yy__(G), iVar5 != 0 && (iVar5 = yymatchChar(G,0x29), iVar5 != 0))))
  {
    yyDo(G,yy_12_term,G->begin,G->end,"yy_12_term");
    goto LAB_0010be09;
  }
  G->pos = iVar7;
  G->thunkpos = iVar3;
  iVar5 = yy_funcref(G);
  if (iVar5 != 0) goto LAB_0010be09;
  G->pos = iVar7;
  G->thunkpos = iVar3;
  yyText(G,G->begin,G->end);
  G->begin = G->pos;
  iVar5 = yymatchString(G,"$~");
  if ((iVar5 != 0) && (iVar5 = yymatchClass(G,(uchar *)"","A-Za-z"), iVar5 != 0)) {
    do {
      iVar1 = G->pos;
      iVar2 = G->thunkpos;
      iVar7 = yymatchClass(G,(uchar *)"","A-Za-z0-9");
    } while (iVar7 != 0);
    G->pos = iVar1;
    G->thunkpos = iVar2;
    yyText(G,G->begin,G->end);
    G->end = G->pos;
    yyDo(G,yy_13_term,G->begin,G->end,"yy_13_term");
    goto LAB_0010be09;
  }
  G->pos = iVar7;
  G->thunkpos = iVar3;
  iVar5 = yymatchChar(G,0x2a);
  if (iVar5 != 0) {
    iVar5 = G->pos;
    iVar4 = G->thunkpos;
    iVar6 = yymatchClass(G,(uchar *)"","*=");
    if (iVar6 == 0) {
      G->pos = iVar5;
      G->thunkpos = iVar4;
      yyDo(G,yy_14_term,G->begin,G->end,"yy_14_term");
      goto LAB_0010be09;
    }
  }
  G->pos = iVar7;
  G->thunkpos = iVar3;
  iVar5 = yy_attr_vars(G);
  if (iVar5 != 0) goto LAB_0010be09;
  G->pos = iVar7;
  G->thunkpos = iVar3;
  iVar5 = yymatchString(G,"rand");
  if (iVar5 != 0) {
    iVar5 = G->pos;
    iVar4 = G->thunkpos;
    iVar6 = yymatchClass(G,(uchar *)"","-a-zA-Z0-9");
    if (iVar6 == 0) {
      G->pos = iVar5;
      G->thunkpos = iVar4;
      yyDo(G,yy_15_term,G->begin,G->end,"yy_15_term");
      goto LAB_0010be09;
    }
  }
  G->pos = iVar7;
  G->thunkpos = iVar3;
  iVar5 = yymatchString(G,"now");
  if (iVar5 != 0) {
    iVar5 = G->pos;
    iVar4 = G->thunkpos;
    iVar6 = yymatchClass(G,(uchar *)"","-a-zA-Z0-9");
    if (iVar6 == 0) {
      G->pos = iVar5;
      G->thunkpos = iVar4;
      yyDo(G,yy_16_term,G->begin,G->end,"yy_16_term");
      goto LAB_0010be09;
    }
  }
  G->pos = iVar7;
  G->thunkpos = iVar3;
  iVar5 = yymatchString(G,"time");
  if (iVar5 != 0) {
    iVar5 = G->pos;
    iVar4 = G->thunkpos;
    iVar6 = yymatchClass(G,(uchar *)"","-a-zA-Z0-9");
    if (iVar6 == 0) {
      G->pos = iVar5;
      G->thunkpos = iVar4;
      yyDo(G,yy_17_term,G->begin,G->end,"yy_17_term");
      goto LAB_0010be09;
    }
  }
  G->pos = iVar7;
  G->thunkpos = iVar3;
  yyDo(G,yy_18_term,G->begin,G->end,"yy_18_term");
  iVar5 = yymatchString(G,"$(");
  if ((iVar5 != 0) && (iVar5 = yy__(G), iVar5 != 0)) {
    iVar5 = G->pos;
    iVar4 = G->thunkpos;
    iVar6 = yy_expr(G);
    if (iVar6 == 0) {
LAB_0010bb89:
      G->pos = iVar5;
      G->thunkpos = iVar4;
    }
    else {
      yyDo(G,yySet,-3,0,"yySet");
      iVar6 = yy__(G);
      if (iVar6 == 0) goto LAB_0010bb89;
    }
    iVar5 = yymatchChar(G,0x29);
    if (iVar5 != 0) {
      yyDo(G,yy_19_term,G->begin,G->end,"yy_19_term");
      goto LAB_0010be09;
    }
  }
  G->pos = iVar7;
  G->thunkpos = iVar3;
  yyDo(G,yy_20_term,G->begin,G->end,"yy_20_term");
  iVar5 = yymatchString(G,"@(");
  if ((iVar5 != 0) && (iVar5 = yy__(G), iVar5 != 0)) {
    iVar5 = G->pos;
    iVar4 = G->thunkpos;
    iVar6 = yy_expr(G);
    if (iVar6 == 0) {
LAB_0010bc9c:
      G->pos = iVar5;
      G->thunkpos = iVar4;
    }
    else {
      yyDo(G,yySet,-3,0,"yySet");
      iVar6 = yy__(G);
      if (iVar6 == 0) goto LAB_0010bc9c;
    }
    iVar5 = yymatchChar(G,0x29);
    if (iVar5 != 0) {
      yyDo(G,yy_21_term,G->begin,G->end,"yy_21_term");
      goto LAB_0010be09;
    }
  }
  G->pos = iVar7;
  G->thunkpos = iVar3;
  yyDo(G,yy_22_term,G->begin,G->end,"yy_22_term");
  iVar7 = yymatchString(G,"%(");
  if ((iVar7 == 0) || (iVar7 = yy__(G), iVar7 == 0)) goto LAB_0010be30;
  iVar7 = G->pos;
  iVar3 = G->thunkpos;
  iVar5 = yy_expr(G);
  if (iVar5 == 0) {
LAB_0010bdb5:
    G->pos = iVar7;
    G->thunkpos = iVar3;
  }
  else {
    yyDo(G,yySet,-3,0,"yySet");
    iVar5 = yy__(G);
    if (iVar5 == 0) goto LAB_0010bdb5;
  }
  iVar7 = yymatchChar(G,0x29);
  if (iVar7 != 0) {
    yyDo(G,yy_23_term,G->begin,G->end,"yy_23_term");
LAB_0010be09:
    yyDo(G,yyPop,3,0,"yyPop");
    return 1;
  }
LAB_0010be30:
  G->pos = iVar1;
  G->thunkpos = iVar2;
  return 0;
}

Assistant:

YY_RULE(int) yy_term(GREG *G)
{  int yypos0= G->pos, yythunkpos0= G->thunkpos;  yyDo(G, yyPush, 3, 0, "yyPush");
  yyprintfv((stderr, "%s\n", "term"));

  {  int yypos451= G->pos, yythunkpos451= G->thunkpos;  if (!yy_complex(G))  goto l452;
  goto l451;
  l452:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  if (!yy_integer(G))  goto l453;
  goto l451;
  l453:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  if (!yy_path(G))  goto l454;
  goto l451;
  l454:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  if (!yy_dec_number(G))  goto l455;
  goto l451;
  l455:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  if (!yy_string(G))  goto l456;
  goto l451;
  l456:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  if (!yymatchChar(G, '(')) goto l457;
  if (!yy__(G))  goto l457;
  if (!yy_expr(G))  goto l457;
  yyDo(G, yySet, -3, 0, "yySet");
  if (!yy__(G))  goto l457;
  if (!yymatchChar(G, ')')) goto l457;
  yyDo(G, yy_1_term, G->begin, G->end, "yy_1_term");
  goto l451;
  l457:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  if (!yy_variable(G))  goto l458;
  goto l451;
  l458:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  if (!yymatchString(G, "$?LINE")) goto l459;
  yyDo(G, yy_2_term, G->begin, G->end, "yy_2_term");
  goto l451;
  l459:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  if (!yy_array(G))  goto l460;
  goto l451;
  l460:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  if (!yy_class(G))  goto l461;
  goto l451;
  l461:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  if (!yy_role(G))  goto l462;
  goto l451;
  l462:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  if (!yy_funcall(G))  goto l463;
  goto l451;
  l463:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  if (!yy_qw(G))  goto l464;
  goto l451;
  l464:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  if (!yy_hash(G))  goto l465;
  goto l451;
  l465:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  if (!yy_lambda(G))  goto l466;
  goto l451;
  l466:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  if (!yy_it_method(G))  goto l467;
  goto l451;
  l467:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  if (!yy_enum(G))  goto l468;
  goto l451;
  l468:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  if (!yymatchString(G, "pi")) goto l469;

  {  int yypos470= G->pos, yythunkpos470= G->thunkpos;  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\000\040\377\003\376\377\377\207\376\377\377\007\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "-a-zA-Z0-9_")) goto l470;
  goto l469;
  l470:;	  G->pos= yypos470; G->thunkpos= yythunkpos470;
  }  yyDo(G, yy_3_term, G->begin, G->end, "yy_3_term");
  goto l451;
  l469:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  if (!yymatchChar(G, 'e')) goto l471;

  {  int yypos472= G->pos, yythunkpos472= G->thunkpos;  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\000\040\377\003\376\377\377\207\376\377\377\007\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "-a-zA-Z0-9_")) goto l472;
  goto l471;
  l472:;	  G->pos= yypos472; G->thunkpos= yythunkpos472;
  }  yyDo(G, yy_4_term, G->begin, G->end, "yy_4_term");
  goto l451;
  l471:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  if (!yymatchString(G, "try")) goto l473;
  if (!yy_ws(G))  goto l473;
  if (!yy__(G))  goto l473;
  if (!yy_block(G))  goto l473;
  yyDo(G, yySet, -2, 0, "yySet");
  yyDo(G, yy_5_term, G->begin, G->end, "yy_5_term");
  goto l451;
  l473:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  if (!yymatchString(G, "try")) goto l474;
  if (!yy_ws(G))  goto l474;

  l475:;	
  {  int yypos476= G->pos, yythunkpos476= G->thunkpos;  if (!yy_ws(G))  goto l476;
  goto l475;
  l476:;	  G->pos= yypos476; G->thunkpos= yythunkpos476;
  }  if (!yy_expr(G))  goto l474;
  yyDo(G, yySet, -2, 0, "yySet");
  yyDo(G, yy_6_term, G->begin, G->end, "yy_6_term");
  goto l451;
  l474:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  if (!yy_perl5_regexp(G))  goto l477;
  goto l451;
  l477:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  if (!yymatchString(G, "m:P5/./")) goto l478;
  yyDo(G, yy_7_term, G->begin, G->end, "yy_7_term");
  goto l451;
  l478:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  if (!yy_regexp(G))  goto l479;
  goto l451;
  l479:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  if (!yymatchString(G, "True")) goto l480;

  {  int yypos481= G->pos, yythunkpos481= G->thunkpos;  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\000\040\377\003\376\377\377\007\376\377\377\007\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "-a-zA-Z0-9")) goto l481;
  goto l480;
  l481:;	  G->pos= yypos481; G->thunkpos= yythunkpos481;
  }  yyDo(G, yy_8_term, G->begin, G->end, "yy_8_term");
  goto l451;
  l480:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  if (!yymatchString(G, "False")) goto l482;

  {  int yypos483= G->pos, yythunkpos483= G->thunkpos;  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\000\040\377\003\376\377\377\007\376\377\377\007\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "-a-zA-Z0-9")) goto l483;
  goto l482;
  l483:;	  G->pos= yypos483; G->thunkpos= yythunkpos483;
  }  yyDo(G, yy_9_term, G->begin, G->end, "yy_9_term");
  goto l451;
  l482:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;
  {  int yypos485= G->pos, yythunkpos485= G->thunkpos;  if (!yy_reserved(G))  goto l485;
  goto l484;
  l485:;	  G->pos= yypos485; G->thunkpos= yythunkpos485;
  }  if (!yy_ident(G))  goto l484;
  goto l451;
  l484:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  yyText(G, G->begin, G->end);  if (!(YY_BEGIN)) goto l486;  if (!yymatchString(G, "class")) goto l486;
  yyText(G, G->begin, G->end);  if (!(YY_END)) goto l486;  yyDo(G, yy_10_term, G->begin, G->end, "yy_10_term");
  goto l451;
  l486:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  if (!yy_pair(G))  goto l487;
  goto l451;
  l487:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  if (!yymatchChar(G, '\\')) goto l488;
  if (!yy_term(G))  goto l488;
  yyDo(G, yySet, -1, 0, "yySet");
  yyDo(G, yy_11_term, G->begin, G->end, "yy_11_term");
  goto l451;
  l488:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  if (!yymatchChar(G, '(')) goto l489;
  if (!yy__(G))  goto l489;
  if (!yymatchChar(G, ')')) goto l489;
  yyDo(G, yy_12_term, G->begin, G->end, "yy_12_term");
  goto l451;
  l489:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  if (!yy_funcref(G))  goto l490;
  goto l451;
  l490:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  yyText(G, G->begin, G->end);  if (!(YY_BEGIN)) goto l491;  if (!yymatchString(G, "$~")) goto l491;
  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\000\000\000\000\376\377\377\007\376\377\377\007\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "A-Za-z")) goto l491;

  l492:;	
  {  int yypos493= G->pos, yythunkpos493= G->thunkpos;  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\000\000\377\003\376\377\377\007\376\377\377\007\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "A-Za-z0-9")) goto l493;
  goto l492;
  l493:;	  G->pos= yypos493; G->thunkpos= yythunkpos493;
  }  yyText(G, G->begin, G->end);  if (!(YY_END)) goto l491;  yyDo(G, yy_13_term, G->begin, G->end, "yy_13_term");
  goto l451;
  l491:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  if (!yymatchChar(G, '*')) goto l494;

  {  int yypos495= G->pos, yythunkpos495= G->thunkpos;  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\000\004\000\040\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "*=")) goto l495;
  goto l494;
  l495:;	  G->pos= yypos495; G->thunkpos= yythunkpos495;
  }  yyDo(G, yy_14_term, G->begin, G->end, "yy_14_term");
  goto l451;
  l494:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  if (!yy_attr_vars(G))  goto l496;
  goto l451;
  l496:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  if (!yymatchString(G, "rand")) goto l497;

  {  int yypos498= G->pos, yythunkpos498= G->thunkpos;  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\000\040\377\003\376\377\377\007\376\377\377\007\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "-a-zA-Z0-9")) goto l498;
  goto l497;
  l498:;	  G->pos= yypos498; G->thunkpos= yythunkpos498;
  }  yyDo(G, yy_15_term, G->begin, G->end, "yy_15_term");
  goto l451;
  l497:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  if (!yymatchString(G, "now")) goto l499;

  {  int yypos500= G->pos, yythunkpos500= G->thunkpos;  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\000\040\377\003\376\377\377\007\376\377\377\007\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "-a-zA-Z0-9")) goto l500;
  goto l499;
  l500:;	  G->pos= yypos500; G->thunkpos= yythunkpos500;
  }  yyDo(G, yy_16_term, G->begin, G->end, "yy_16_term");
  goto l451;
  l499:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  if (!yymatchString(G, "time")) goto l501;

  {  int yypos502= G->pos, yythunkpos502= G->thunkpos;  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\000\040\377\003\376\377\377\007\376\377\377\007\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "-a-zA-Z0-9")) goto l502;
  goto l501;
  l502:;	  G->pos= yypos502; G->thunkpos= yythunkpos502;
  }  yyDo(G, yy_17_term, G->begin, G->end, "yy_17_term");
  goto l451;
  l501:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  yyDo(G, yy_18_term, G->begin, G->end, "yy_18_term");
  if (!yymatchString(G, "$(")) goto l503;
  if (!yy__(G))  goto l503;

  {  int yypos504= G->pos, yythunkpos504= G->thunkpos;  if (!yy_expr(G))  goto l504;
  yyDo(G, yySet, -3, 0, "yySet");
  if (!yy__(G))  goto l504;
  goto l505;
  l504:;	  G->pos= yypos504; G->thunkpos= yythunkpos504;
  }
  l505:;	  if (!yymatchChar(G, ')')) goto l503;
  yyDo(G, yy_19_term, G->begin, G->end, "yy_19_term");
  goto l451;
  l503:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  yyDo(G, yy_20_term, G->begin, G->end, "yy_20_term");
  if (!yymatchString(G, "@(")) goto l506;
  if (!yy__(G))  goto l506;

  {  int yypos507= G->pos, yythunkpos507= G->thunkpos;  if (!yy_expr(G))  goto l507;
  yyDo(G, yySet, -3, 0, "yySet");
  if (!yy__(G))  goto l507;
  goto l508;
  l507:;	  G->pos= yypos507; G->thunkpos= yythunkpos507;
  }
  l508:;	  if (!yymatchChar(G, ')')) goto l506;
  yyDo(G, yy_21_term, G->begin, G->end, "yy_21_term");
  goto l451;
  l506:;	  G->pos= yypos451; G->thunkpos= yythunkpos451;  yyDo(G, yy_22_term, G->begin, G->end, "yy_22_term");
  if (!yymatchString(G, "%(")) goto l450;
  if (!yy__(G))  goto l450;

  {  int yypos509= G->pos, yythunkpos509= G->thunkpos;  if (!yy_expr(G))  goto l509;
  yyDo(G, yySet, -3, 0, "yySet");
  if (!yy__(G))  goto l509;
  goto l510;
  l509:;	  G->pos= yypos509; G->thunkpos= yythunkpos509;
  }
  l510:;	  if (!yymatchChar(G, ')')) goto l450;
  yyDo(G, yy_23_term, G->begin, G->end, "yy_23_term");

  }
  l451:;	  yyprintf((stderr, "  ok   term"));
  yyprintfGcontext;
  yyprintf((stderr, "\n"));
  yyDo(G, yyPop, 3, 0, "yyPop");
  return 1;
  l450:;	  G->pos= yypos0; G->thunkpos= yythunkpos0;  yyprintfv((stderr, "  fail %s", "term"));
  yyprintfvGcontext;
  yyprintfv((stderr, "\n"));

  return 0;
}